

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O3

void __thiscall NaPetriNet::NaPetriNet(NaPetriNet *this,char *szNetName)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  FILE *pFVar4;
  char *szEnvValue;
  char szEnvName [1024];
  char acStack_428 [1024];
  
  this->_vptr_NaPetriNet = (_func_int **)&PTR__NaPetriNet_00176438;
  NaInfoStand::NaInfoStand(&this->istand);
  (this->pnaNet)._vptr_NaDynAr = (_func_int **)&PTR__NaDynAr_001764c8;
  (this->pnaNet).nItems = 0;
  (this->pnaNet).pHead = (item *)0x0;
  (this->pnaNet).pTail = (item *)0x0;
  this->pTimer = &TheTimer;
  this->bTimeChart = false;
  this->dfTimeChart = (NaDataFile *)0x0;
  this->pTimingNode = (NaPetriNode *)0x0;
  this->fpMap = (FILE *)0x0;
  this->fpDig = (FILE *)0x0;
  if (szNetName == (char *)0x0) {
    pcVar1 = autoname("pnet",&iNetNumber);
  }
  else {
    pcVar1 = newstr(szNetName);
  }
  this->szName = pcVar1;
  sprintf(acStack_428,"%s_printout",pcVar1);
  pcVar1 = getenv(acStack_428);
  if (pcVar1 == (char *)0x0) {
    this->bInitPrintout = false;
    this->bPrepPrintout = false;
    this->bStepPrintout = false;
    this->bTermPrintout = false;
    this->bMapPrintout = false;
    this->bDigPrintout = true;
  }
  else {
    pcVar2 = strchr(pcVar1,0x69);
    this->bInitPrintout = pcVar2 != (char *)0x0;
    pcVar2 = strchr(pcVar1,0x70);
    this->bPrepPrintout = pcVar2 != (char *)0x0;
    pcVar2 = strchr(pcVar1,0x73);
    this->bStepPrintout = pcVar2 != (char *)0x0;
    pcVar2 = strchr(pcVar1,0x74);
    this->bTermPrintout = pcVar2 != (char *)0x0;
    pcVar2 = strchr(pcVar1,0x6d);
    this->bMapPrintout = pcVar2 != (char *)0x0;
    pcVar1 = strchr(pcVar1,0x67);
    this->bDigPrintout = pcVar1 != (char *)0x0;
    if (pcVar1 == (char *)0x0) {
      return;
    }
  }
  pcVar1 = this->szName;
  sVar3 = strlen(pcVar1);
  pcVar2 = (char *)operator_new__(sVar3 + 5);
  sprintf(pcVar2,"%s.dot",pcVar1);
  pFVar4 = fopen(pcVar2,"wt");
  this->fpDig = (FILE *)pFVar4;
  if (pFVar4 == (FILE *)0x0) {
    NaPrintLog("Failed to write digraph output\n");
  }
  else {
    NaPrintLog("Digraph output will be put to \'%s\'\n",pcVar2);
  }
  operator_delete__(pcVar2);
  fprintf((FILE *)this->fpDig,
          "digraph %s {\n  graph [ rankdir = LR ] ;\n  node [ shape = record ] ;\n\n",this->szName);
  return;
}

Assistant:

NaPetriNet::NaPetriNet (const char* szNetName)
{
    // Setup default timer
    pTimer = &TheTimer;
    bTimeChart = false;
    dfTimeChart = NULL;
    pTimingNode = NULL;

    fpMap = NULL;
    fpDig = NULL;

    if(NULL == szNetName)
        szName = autoname("pnet", iNetNumber);
    else
        szName = newstr(szNetName);


    /* setup verbose from program environment */
    char	szEnvName[1024];
    sprintf(szEnvName, "%s_printout", szName);
    if(NULL == getenv(szEnvName))
      {
	bInitPrintout = false;				// initialize(???)
	bPrepPrintout = false;				// prepare(???)
	bStepPrintout = false;				// step_alive(???)
	bTermPrintout = false;				// terminate(???)
	bMapPrintout = false;				// no activation map
	bDigPrintout = true;				// no digraph output
      }
    else
      {
	char	*szEnvValue = getenv(szEnvName);
	bInitPrintout = !!strchr(szEnvValue, 'i');	// initialize(true)
	bPrepPrintout = !!strchr(szEnvValue, 'p');	// prepare(true)
	bStepPrintout = !!strchr(szEnvValue, 's');	// step_alive(true)
	bTermPrintout = !!strchr(szEnvValue, 't');	// terminate(true)
	bMapPrintout = !!strchr(szEnvValue, 'm');	// print activation map
	bDigPrintout = !!strchr(szEnvValue, 'g');	// digraph output
      }

    if(bDigPrintout) {
	char	*szDigName = new char[strlen(name()) + sizeof(".dot")];
	sprintf(szDigName, "%s.dot", name());
	fpDig = fopen(szDigName, "wt");
	if(NULL == fpDig){
	    NaPrintLog("Failed to write digraph output\n");
	}else{
	    NaPrintLog("Digraph output will be put to '%s'\n", szDigName);
	}
	delete[] szDigName;

	fprintf(fpDig, "digraph %s {\n"\
		"  graph [ rankdir = LR ] ;\n"\
		"  node [ shape = record ] ;\n\n",
		name());
    }
}